

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_COORD.cpp
# Opt level: O2

PP_COORD * __thiscall
PP_COORD::operator<=(PP_COORD *__return_storage_ptr__,PP_COORD *this,double *a)

{
  double dVar1;
  
  PP_COORD(__return_storage_ptr__);
  dVar1 = *a;
  if (this->x <= dVar1) {
    __return_storage_ptr__->x = 1.0;
  }
  if (this->y <= dVar1) {
    __return_storage_ptr__->y = 1.0;
  }
  if (this->z <= dVar1) {
    __return_storage_ptr__->z = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

PP_COORD PP_COORD::operator<= (double const& a)
{
    PP_COORD b;//init to the null vector
    if(x<=a) b.x=1.0;
    if(y<=a) b.y=1.0;
    if(z<=a) b.z=1.0;
    return b;
}